

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

size_t __thiscall llvm::StringRef::rfind(StringRef *this,StringRef Str)

{
  StringRef RHS;
  bool bVar1;
  StringRef local_50;
  size_t local_40;
  size_t e;
  size_t i;
  size_t N;
  StringRef *this_local;
  StringRef Str_local;
  
  Str_local.Data = (char *)Str.Length;
  this_local = (StringRef *)Str.Data;
  N = (size_t)this;
  i = size((StringRef *)&this_local);
  if (this->Length < i) {
    Str_local.Length = 0xffffffffffffffff;
  }
  else {
    e = (this->Length - i) + 1;
    local_40 = 0;
    do {
      if (e == local_40) {
        return 0xffffffffffffffff;
      }
      e = e - 1;
      local_50 = substr(this,e,i);
      RHS.Length = (size_t)Str_local.Data;
      RHS.Data = (char *)this_local;
      bVar1 = equals(&local_50,RHS);
    } while (!bVar1);
    Str_local.Length = e;
  }
  return Str_local.Length;
}

Assistant:

size_t StringRef::rfind(StringRef Str) const {
  size_t N = Str.size();
  if (N > Length)
    return npos;
  for (size_t i = Length - N + 1, e = 0; i != e;) {
    --i;
    if (substr(i, N).equals(Str))
      return i;
  }
  return npos;
}